

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall helics::ValueFederate::~ValueFederate(ValueFederate *this)

{
  ValueFederate *in_RDI;
  Federate *unaff_retaddr;
  void **in_stack_ffffffffffffffe8;
  
  ~ValueFederate(in_RDI,in_stack_ffffffffffffffe8);
  Federate::~Federate(unaff_retaddr);
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}